

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall
docopt::BranchPattern::collect_leaves
          (BranchPattern *this,
          vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *lst)

{
  bool bVar1;
  __shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  shared_ptr<docopt::Pattern> *child;
  iterator __end2;
  iterator __begin2;
  PatternList *__range2;
  vector<docopt::LeafPattern_*,_std::allocator<docopt::LeafPattern_*>_> *lst_local;
  BranchPattern *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ::begin(&this->fChildren);
  child = (shared_ptr<docopt::Pattern> *)
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::end(&this->fChildren);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                                *)&child);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
              ::operator*(&__end2);
    peVar2 = std::__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (*peVar2->_vptr_Pattern[1])(peVar2,lst);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

virtual void collect_leaves(std::vector<LeafPattern*>& lst) override final {
			for(auto& child : fChildren) {
				child->collect_leaves(lst);
			}
		}